

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::GetAttribute(Prim *prim,string *attr_name,Attribute *out_attr,string *err)

{
  bool bVar1;
  ostream *poVar2;
  Attribute *pAVar3;
  string local_990 [39];
  allocator local_969;
  string local_968 [32];
  fmt local_948 [32];
  ostringstream local_928 [8];
  ostringstream ss_e_1;
  undefined1 local_7a8 [8];
  Property prop;
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  string *err_local;
  Attribute *out_attr_local;
  string *attr_name_local;
  Prim *prim_local;
  
  if (out_attr == (Attribute *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7ea);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a8,"`out_attr` argument is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&prop._has_custom);
      ::std::__cxx11::string::~string((string *)&prop._has_custom);
    }
    prim_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    Property::Property((Property *)local_7a8);
    bVar1 = GetProperty(prim,attr_name,(Property *)local_7a8,err);
    if (bVar1) {
      bVar1 = Property::is_attribute((Property *)local_7a8);
      if (bVar1) {
        pAVar3 = Property::get_attribute((Property *)local_7a8);
        Attribute::operator=(out_attr,pAVar3);
        prim_local._7_1_ = true;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_928);
        poVar2 = ::std::operator<<((ostream *)local_928,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"GetAttribute");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7f8);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_968,"{} is not a Attribute.",&local_969);
        fmt::format<std::__cxx11::string>
                  (local_948,(string *)local_968,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name);
        poVar2 = ::std::operator<<((ostream *)local_928,(string *)local_948);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_948);
        ::std::__cxx11::string::~string(local_968);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_969);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,local_990);
          ::std::__cxx11::string::~string(local_990);
        }
        prim_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_928);
      }
    }
    else {
      prim_local._7_1_ = false;
    }
    Property::~Property((Property *)local_7a8);
  }
  return prim_local._7_1_;
}

Assistant:

bool GetAttribute(const tinyusdz::Prim &prim, const std::string &attr_name,
                  Attribute *out_attr, std::string *err) {
  if (!out_attr) {
    PUSH_ERROR_AND_RETURN("`out_attr` argument is nullptr.");
  }

  // First lookup as Property, then check if its Attribute
  Property prop;
  if (!GetProperty(prim, attr_name, &prop, err)) {
    return false;
  }

  if (prop.is_attribute()) {
    (*out_attr) = std::move(prop.get_attribute());
    return true;
  }

  PUSH_ERROR_AND_RETURN(fmt::format("{} is not a Attribute.", attr_name));
}